

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O3

MessageType __thiscall cmMessenger::ConvertMessageType(cmMessenger *this,MessageType t)

{
  bool bVar1;
  MessageType MVar2;
  
  if (t < FATAL_ERROR) {
    bVar1 = GetDevWarningsAsErrors(this);
    if (t == AUTHOR_WARNING && bVar1) {
      return AUTHOR_ERROR;
    }
    MVar2 = AUTHOR_WARNING;
    if (bVar1) {
      MVar2 = t;
    }
    bVar1 = t == AUTHOR_ERROR;
  }
  else {
    if (1 < t - DEPRECATION_ERROR) {
      return t;
    }
    bVar1 = GetDeprecatedWarningsAsErrors(this);
    if (t == DEPRECATION_WARNING && bVar1) {
      return DEPRECATION_ERROR;
    }
    MVar2 = DEPRECATION_WARNING;
    if (bVar1) {
      MVar2 = t;
    }
    bVar1 = t == DEPRECATION_ERROR;
  }
  if (!bVar1) {
    MVar2 = t;
  }
  return MVar2;
}

Assistant:

cmake::MessageType cmMessenger::ConvertMessageType(cmake::MessageType t) const
{
  bool warningsAsErrors;

  if (t == cmake::AUTHOR_WARNING || t == cmake::AUTHOR_ERROR) {
    warningsAsErrors = this->GetDevWarningsAsErrors();
    if (warningsAsErrors && t == cmake::AUTHOR_WARNING) {
      t = cmake::AUTHOR_ERROR;
    } else if (!warningsAsErrors && t == cmake::AUTHOR_ERROR) {
      t = cmake::AUTHOR_WARNING;
    }
  } else if (t == cmake::DEPRECATION_WARNING ||
             t == cmake::DEPRECATION_ERROR) {
    warningsAsErrors = this->GetDeprecatedWarningsAsErrors();
    if (warningsAsErrors && t == cmake::DEPRECATION_WARNING) {
      t = cmake::DEPRECATION_ERROR;
    } else if (!warningsAsErrors && t == cmake::DEPRECATION_ERROR) {
      t = cmake::DEPRECATION_WARNING;
    }
  }

  return t;
}